

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

OptionBase<Inferences::ALASCA::FourierMotzkinConf::Rhs> * __thiscall
Lib::OptionBase<Inferences::ALASCA::FourierMotzkinConf::Rhs>::operator=
          (OptionBase<Inferences::ALASCA::FourierMotzkinConf::Rhs> *this,
          OptionBase<Inferences::ALASCA::FourierMotzkinConf::Rhs> *other)

{
  bool bVar1;
  SelectedSummand local_50;
  
  bVar1 = other->_isSome;
  if (bVar1 == true) {
    Kernel::SelectedSummand::SelectedSummand(&local_50,(SelectedSummand *)&other->_elem);
    Kernel::SelectedSummand::SelectedSummand((SelectedSummand *)&this->_elem,&local_50);
    bVar1 = other->_isSome;
  }
  this->_isSome = bVar1;
  return this;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }